

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall
ccs::no_such_property::no_such_property(no_such_property *this,string *name,CcsContext *context)

{
  ostream *poVar1;
  ostringstream str;
  __shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  *(undefined ***)this = &PTR__no_such_property_00172b50;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  std::__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> *)&this->context,
             (__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> *)context);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"no such property: \'");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"\' (in context: ");
  std::__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1d0,(__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> *)context);
  poVar1 = operator<<(poVar1,local_1d0._M_ptr);
  std::operator<<(poVar1,")");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->msg,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

no_such_property::no_such_property(const std::string &name, CcsContext context)
  : context(context) {
  std::ostringstream str;
  str << "no such property: '" << name << "' (in context: " << context << ")";
  msg = str.str();
}